

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O0

int __thiscall
qclab::qgates::RotationY<double>::toQASM(RotationY<double> *this,ostream *stream,int offset)

{
  int iVar1;
  real_type angle;
  __string_type local_40;
  int local_1c;
  ostream *poStack_18;
  int offset_local;
  ostream *stream_local;
  RotationY<double> *this_local;
  
  iVar1 = (this->super_QRotationGate1<double>).super_QGate1<double>.qubit_;
  local_1c = offset;
  poStack_18 = stream;
  stream_local = (ostream *)this;
  angle = QRotationGate1<double>::theta(&this->super_QRotationGate1<double>);
  qasmRy<double>(&local_40,iVar1 + offset,angle);
  std::operator<<(stream,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmRy( this->qubit_ + offset , this->theta() ) ;
          return 0 ;
        }